

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O1

void duckdb::ConstantScanPartial<short>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  ulong uVar6;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  int iVar32;
  undefined1 auVar30 [16];
  int iVar33;
  undefined1 auVar31 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar36 [16];
  
  pdVar1 = result->data;
  sVar5 = NumericStats::GetMin<short>(&(segment->stats).statistics);
  auVar4 = _DAT_01352200;
  if (scan_count != 0) {
    lVar7 = scan_count - 1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_01352200;
    auVar11 = _DAT_0135a350;
    auVar12 = _DAT_0135a360;
    auVar13 = _DAT_0135a330;
    auVar14 = _DAT_0135a310;
    do {
      auVar15 = auVar14 ^ auVar4;
      iVar29 = auVar8._0_4_;
      iVar28 = -(uint)(iVar29 < auVar15._0_4_);
      iVar9 = auVar8._4_4_;
      auVar16._4_4_ = -(uint)(iVar9 < auVar15._4_4_);
      iVar33 = auVar8._8_4_;
      iVar32 = -(uint)(iVar33 < auVar15._8_4_);
      iVar10 = auVar8._12_4_;
      auVar16._12_4_ = -(uint)(iVar10 < auVar15._12_4_);
      auVar25._4_4_ = iVar28;
      auVar25._0_4_ = iVar28;
      auVar25._8_4_ = iVar32;
      auVar25._12_4_ = iVar32;
      auVar34 = pshuflw(in_XMM11,auVar25,0xe8);
      auVar18._4_4_ = -(uint)(auVar15._4_4_ == iVar9);
      auVar18._12_4_ = -(uint)(auVar15._12_4_ == iVar10);
      auVar18._0_4_ = auVar18._4_4_;
      auVar18._8_4_ = auVar18._12_4_;
      auVar36 = pshuflw(in_XMM12,auVar18,0xe8);
      auVar16._0_4_ = auVar16._4_4_;
      auVar16._8_4_ = auVar16._12_4_;
      auVar35 = pshuflw(auVar34,auVar16,0xe8);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar15 = (auVar35 | auVar36 & auVar34) ^ auVar15;
      auVar15 = packssdw(auVar15,auVar15);
      if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)(pdVar1 + uVar6 * 2 + result_offset * 2) = sVar5;
      }
      auVar16 = auVar18 & auVar25 | auVar16;
      auVar15 = packssdw(auVar16,auVar16);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar35,auVar15 ^ auVar35);
      if ((auVar15._0_4_ >> 0x10 & 1) != 0) {
        *(short *)(pdVar1 + uVar6 * 2 + result_offset * 2 + 2) = sVar5;
      }
      auVar15 = auVar13 ^ auVar4;
      iVar28 = -(uint)(iVar29 < auVar15._0_4_);
      auVar30._4_4_ = -(uint)(iVar9 < auVar15._4_4_);
      iVar32 = -(uint)(iVar33 < auVar15._8_4_);
      auVar30._12_4_ = -(uint)(iVar10 < auVar15._12_4_);
      auVar17._4_4_ = iVar28;
      auVar17._0_4_ = iVar28;
      auVar17._8_4_ = iVar32;
      auVar17._12_4_ = iVar32;
      auVar24._4_4_ = -(uint)(auVar15._4_4_ == iVar9);
      auVar24._12_4_ = -(uint)(auVar15._12_4_ == iVar10);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar15 = auVar24 & auVar17 | auVar30;
      auVar15 = packssdw(auVar15,auVar15);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar2,auVar15 ^ auVar2);
      if ((auVar15 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(pdVar1 + uVar6 * 2 + result_offset * 2 + 4) = sVar5;
      }
      auVar18 = pshufhw(auVar17,auVar17,0x84);
      auVar25 = pshufhw(auVar24,auVar24,0x84);
      auVar16 = pshufhw(auVar18,auVar30,0x84);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar19 = (auVar16 | auVar25 & auVar18) ^ auVar19;
      auVar18 = packssdw(auVar19,auVar19);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(pdVar1 + uVar6 * 2 + result_offset * 2 + 6) = sVar5;
      }
      auVar18 = auVar12 ^ auVar4;
      iVar28 = -(uint)(iVar29 < auVar18._0_4_);
      auVar21._4_4_ = -(uint)(iVar9 < auVar18._4_4_);
      iVar32 = -(uint)(iVar33 < auVar18._8_4_);
      auVar21._12_4_ = -(uint)(iVar10 < auVar18._12_4_);
      auVar26._4_4_ = iVar28;
      auVar26._0_4_ = iVar28;
      auVar26._8_4_ = iVar32;
      auVar26._12_4_ = iVar32;
      auVar15 = pshuflw(auVar15,auVar26,0xe8);
      auVar20._4_4_ = -(uint)(auVar18._4_4_ == iVar9);
      auVar20._12_4_ = -(uint)(auVar18._12_4_ == iVar10);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      in_XMM12 = pshuflw(auVar36 & auVar34,auVar20,0xe8);
      in_XMM12 = in_XMM12 & auVar15;
      auVar21._0_4_ = auVar21._4_4_;
      auVar21._8_4_ = auVar21._12_4_;
      auVar15 = pshuflw(auVar15,auVar21,0xe8);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar15 | in_XMM12) ^ auVar34;
      auVar15 = packssdw(auVar34,auVar34);
      if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)(pdVar1 + uVar6 * 2 + result_offset * 2 + 8) = sVar5;
      }
      auVar21 = auVar20 & auVar26 | auVar21;
      auVar15 = packssdw(auVar21,auVar21);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar36,auVar15 ^ auVar36);
      if ((auVar15 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(short *)(pdVar1 + uVar6 * 2 + result_offset * 2 + 10) = sVar5;
      }
      auVar15 = auVar11 ^ auVar4;
      iVar29 = -(uint)(iVar29 < auVar15._0_4_);
      auVar31._4_4_ = -(uint)(iVar9 < auVar15._4_4_);
      iVar33 = -(uint)(iVar33 < auVar15._8_4_);
      auVar31._12_4_ = -(uint)(iVar10 < auVar15._12_4_);
      auVar22._4_4_ = iVar29;
      auVar22._0_4_ = iVar29;
      auVar22._8_4_ = iVar33;
      auVar22._12_4_ = iVar33;
      auVar27._4_4_ = -(uint)(auVar15._4_4_ == iVar9);
      auVar27._12_4_ = -(uint)(auVar15._12_4_ == iVar10);
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar15 = auVar27 & auVar22 | auVar31;
      auVar15 = packssdw(auVar15,auVar15);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar15 ^ auVar3,auVar15 ^ auVar3);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(pdVar1 + uVar6 * 2 + result_offset * 2 + 0xc) = sVar5;
      }
      auVar15 = pshufhw(auVar22,auVar22,0x84);
      auVar16 = pshufhw(auVar27,auVar27,0x84);
      auVar18 = pshufhw(auVar15,auVar31,0x84);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar18 | auVar16 & auVar15) ^ auVar23;
      auVar15 = packssdw(auVar23,auVar23);
      if ((auVar15 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(pdVar1 + uVar6 * 2 + result_offset * 2 + 0xe) = sVar5;
      }
      uVar6 = uVar6 + 8;
      lVar7 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 8;
      auVar14._8_8_ = lVar7 + 8;
      lVar7 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 8;
      auVar13._8_8_ = lVar7 + 8;
      lVar7 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 8;
      auVar12._8_8_ = lVar7 + 8;
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 8;
      auVar11._8_8_ = lVar7 + 8;
    } while ((scan_count + 7 & 0xfffffffffffffff8) != uVar6);
  }
  return;
}

Assistant:

void ConstantScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                         idx_t result_offset) {
	ConstantFillFunction<T>(segment, result, result_offset, scan_count);
}